

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O3

cbtScalar __thiscall
cbtTaskSchedulerDefault::parallelSum
          (cbtTaskSchedulerDefault *this,int iBegin,int iEnd,int grainSize,cbtIParallelSumBody *body
          )

{
  cbtSpinMutex *this_00;
  int iVar1;
  ThreadLocalStorage *pTVar2;
  JobQueue *this_01;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int jobCount;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined4 uVar19;
  float fVar20;
  CProfileSample __profile_1;
  CProfileSample __profile;
  CProfileSample local_4a;
  CProfileSample local_49;
  cbtIParallelSumBody *local_48;
  ulong local_40;
  cbtSpinMutex *local_38;
  
  uVar8 = (ulong)(uint)grainSize;
  local_48 = body;
  CProfileSample::CProfileSample(&local_49,"parallelSum_ThreadSupport");
  local_40 = uVar8;
  if ((grainSize < iEnd - iBegin) && (0 < this->m_numWorkerThreads)) {
    this_00 = &this->m_antiNestingLock;
    bVar6 = cbtSpinMutex::tryLock(this_00);
    if (bVar6) {
      jobCount = ((int)local_40 + -1 + (iEnd - iBegin)) / (int)local_40;
      this->m_numJobs = jobCount;
      local_38 = this_00;
      if (0 < this->m_numActiveJobQueues) {
        lVar11 = 0;
        lVar10 = 0;
        do {
          JobQueue::clearQueue
                    ((JobQueue *)(((this->m_jobQueues).m_data)->m_cachePadding + lVar11 + -0x78),
                     jobCount,0x20);
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0xb8;
        } while (lVar10 < this->m_numActiveJobQueues);
      }
      if (0 < this->m_numThreads) {
        auVar12 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar14 = vpbroadcastq_avx512f(ZEXT816(0x38));
        auVar15 = vpbroadcastq_avx512f(ZEXT816(0x10));
        pTVar2 = (this->m_threadLocalStorage).m_data;
        uVar8 = (ulong)(this->m_numThreads + 0xfU & 0xfffffff0);
        auVar16 = vpbroadcastq_avx512f();
        do {
          auVar17 = vpmullq_avx512dq(auVar12,auVar14);
          auVar18 = vpmullq_avx512dq(auVar13,auVar14);
          uVar4 = vpcmpuq_avx512f(auVar13,auVar16,2);
          uVar5 = vpcmpuq_avx512f(auVar12,auVar16,2);
          auVar13 = vpaddq_avx512f(auVar13,auVar15);
          auVar12 = vpaddq_avx512f(auVar12,auVar15);
          uVar8 = uVar8 - 0x10;
          vscatterqps_avx512f(ZEXT864(pTVar2) + ZEXT864(0x10) + auVar18,uVar4,
                              ZEXT1632(ZEXT816(0) << 0x40));
          vscatterqps_avx512f(ZEXT864(pTVar2) + ZEXT864(0x10) + auVar17,uVar5,
                              ZEXT1632(ZEXT816(0) << 0x40));
        } while (uVar8 != 0);
      }
      prepareWorkerThreads(this);
      if (iBegin < iEnd) {
        iVar9 = 1;
        do {
          this_01 = (this->m_perThreadJobQueues).m_data[iVar9];
          iVar1 = this_01->m_allocSize;
          pcVar3 = this_01->m_jobMem;
          this_01->m_allocSize = iVar1 + 0x20;
          pTVar2 = (this->m_threadLocalStorage).m_data;
          *(undefined ***)(pcVar3 + iVar1) = &PTR_executeJob_00b4bf20;
          *(cbtIParallelSumBody **)(pcVar3 + (long)iVar1 + 8) = local_48;
          *(ThreadLocalStorage **)(pcVar3 + (long)iVar1 + 0x10) = pTVar2;
          *(int *)(pcVar3 + (long)iVar1 + 0x18) = iBegin;
          iBegin = iBegin + (int)local_40;
          iVar7 = iEnd;
          if (iBegin < iEnd) {
            iVar7 = iBegin;
          }
          *(int *)(pcVar3 + (long)iVar1 + 0x1c) = iVar7;
          JobQueue::submitJob(this_01,(IJob *)(pcVar3 + iVar1));
          iVar9 = iVar9 + 1;
          if (this->m_numThreads <= iVar9) {
            iVar9 = 1;
          }
        } while (iBegin < iEnd);
      }
      wakeWorkers(this,jobCount + -1);
      waitJobs(this);
      if ((long)this->m_numThreads < 1) {
        fVar20 = 0.0;
      }
      else {
        fVar20 = 0.0;
        lVar10 = 0;
        do {
          fVar20 = fVar20 + *(float *)((long)&((this->m_threadLocalStorage).m_data)->m_sumResult +
                                      lVar10);
          lVar10 = lVar10 + 0x38;
        } while ((long)this->m_numThreads * 0x38 - lVar10 != 0);
      }
      local_48 = (cbtIParallelSumBody *)CONCAT44(local_48._4_4_,fVar20);
      cbtSpinMutex::unlock(local_38);
      goto LAB_008f5237;
    }
  }
  CProfileSample::CProfileSample(&local_4a,"parallelSum_mainThread");
  uVar19 = (**(code **)(*(long *)local_48 + 0x10))(local_48,iBegin,iEnd);
  local_48 = (cbtIParallelSumBody *)CONCAT44(local_48._4_4_,uVar19);
  CProfileSample::~CProfileSample(&local_4a);
LAB_008f5237:
  CProfileSample::~CProfileSample(&local_49);
  return local_48._0_4_;
}

Assistant:

virtual cbtScalar parallelSum(int iBegin, int iEnd, int grainSize, const cbtIParallelSumBody& body) BT_OVERRIDE
	{
		BT_PROFILE("parallelSum_ThreadSupport");
		cbtAssert(iEnd >= iBegin);
		cbtAssert(grainSize >= 1);
		int iterationCount = iEnd - iBegin;
		if (iterationCount > grainSize && m_numWorkerThreads > 0 && m_antiNestingLock.tryLock())
		{
			typedef ParallelSumJob JobType;
			int jobCount = (iterationCount + grainSize - 1) / grainSize;
			m_numJobs = jobCount;
			cbtAssert(jobCount >= 2);  // need more than one job for multithreading
			int jobSize = sizeof(JobType);
			for (int i = 0; i < m_numActiveJobQueues; ++i)
			{
				m_jobQueues[i].clearQueue(jobCount, jobSize);
			}

			// initialize summation
			for (int iThread = 0; iThread < m_numThreads; ++iThread)
			{
				m_threadLocalStorage[iThread].m_sumResult = cbtScalar(0);
			}

			// prepare worker threads for incoming work
			prepareWorkerThreads();
			// submit all of the jobs
			int iJob = 0;
			int iThread = kFirstWorkerThreadId;  // first worker thread
			for (int i = iBegin; i < iEnd; i += grainSize)
			{
				cbtAssert(iJob < jobCount);
				int iE = cbtMin(i + grainSize, iEnd);
				JobQueue* jq = m_perThreadJobQueues[iThread];
				cbtAssert(jq);
				cbtAssert((jq - &m_jobQueues[0]) < m_numActiveJobQueues);
				void* jobMem = jq->allocJobMem(jobSize);
				JobType* job = new (jobMem) ParallelSumJob(i, iE, body, &m_threadLocalStorage[0]);  // placement new
				jq->submitJob(job);
				iJob++;
				iThread++;
				if (iThread >= m_numThreads)
				{
					iThread = kFirstWorkerThreadId;  // first worker thread
				}
			}
			wakeWorkers(jobCount - 1);

			// put the main thread to work on emptying the job queue and then wait for all workers to finish
			waitJobs();

			// add up all the thread sums
			cbtScalar sum = cbtScalar(0);
			for (int iThread = 0; iThread < m_numThreads; ++iThread)
			{
				sum += m_threadLocalStorage[iThread].m_sumResult;
			}
			m_antiNestingLock.unlock();
			return sum;
		}
		else
		{
			BT_PROFILE("parallelSum_mainThread");
			// just run on main thread
			return body.sumLoop(iBegin, iEnd);
		}
	}